

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constraints.cpp
# Opt level: O0

int Am_Center_X_Is_Center_Of_proc(Am_Object *self)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  Am_Value *pAVar4;
  int center_x_obj_width;
  int center_x_obj_left;
  Am_Object local_28;
  Am_Object center_x_obj;
  int my_width;
  Am_Object *self_local;
  
  pAVar4 = Am_Object::Get(self,0x66,0);
  center_x_obj.data._4_4_ = Am_Value::operator_cast_to_int(pAVar4);
  Am_Object::Am_Object(&local_28);
  pAVar4 = Am_Object::Get(self,0xb3,0);
  Am_Object::operator=(&local_28,pAVar4);
  bVar1 = Am_Object::Valid(&local_28);
  if (bVar1) {
    pAVar4 = Am_Object::Get(&local_28,100,0);
    iVar2 = Am_Value::operator_cast_to_int(pAVar4);
    pAVar4 = Am_Object::Get(&local_28,0x66,0);
    iVar3 = Am_Value::operator_cast_to_int(pAVar4);
    self_local._4_4_ = iVar2 + (iVar3 - center_x_obj.data._4_4_) / 2;
  }
  else {
    self_local._4_4_ = 0;
  }
  Am_Object::~Am_Object(&local_28);
  return self_local._4_4_;
}

Assistant:

Am_Define_Formula(int, Am_Center_X_Is_Center_Of)
{
  int my_width = self.Get(Am_WIDTH);
  Am_Object center_x_obj;
  center_x_obj = self.Get(Am_CENTER_X_OBJ);
  if (center_x_obj.Valid()) {
    int center_x_obj_left = center_x_obj.Get(Am_LEFT);
    int center_x_obj_width = center_x_obj.Get(Am_WIDTH);
    return center_x_obj_left + ((center_x_obj_width - my_width) / 2);
  } else {
    return 0;
  }
}